

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unordered_map.cpp
# Opt level: O1

bool operator==(string self,case_insensitive other)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined2 local_2c;
  char local_2a;
  
  local_2a = other.data[2];
  if (self.size_ == 3) {
    local_2c._0_1_ = other.data[0];
    iVar3 = (int)(char)local_2c;
    local_2c = other.data._0_2_;
    iVar2 = tolower((int)*self.data_);
    iVar3 = tolower(iVar3);
    if (iVar2 == iVar3) {
      lVar4 = 1;
      do {
        if (lVar4 == 3) {
          return lVar4 == 3;
        }
        cVar1 = *(char *)((long)&local_2c + lVar4);
        iVar2 = tolower((int)self.data_[lVar4]);
        iVar3 = tolower((int)cVar1);
        lVar4 = lVar4 + 1;
      } while (iVar2 == iVar3);
    }
  }
  return false;
}

Assistant:

bool operator==(frozen::string self, case_insensitive other) {
    return std::equal(self.begin(), self.end(), other.data, other.data + 3,
        [](char s, char o) { return std::tolower(s) == std::tolower(o);});
  }